

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

bool __thiscall
slang::ast::ValueExpressionBase::checkVariableAssignment
          (ValueExpressionBase *this,ASTContext *context,VariableSymbol *var,
          bitmask<slang::ast::AssignFlags> flags,SourceLocation assignLoc,SourceRange varRange)

{
  int iVar1;
  int *piVar2;
  ushort uVar3;
  Expression *pEVar4;
  DiagCode DVar5;
  undefined7 in_register_00000009;
  DiagCode code;
  ValueExpressionBase *pVVar6;
  bool bVar7;
  anon_class_32_4_231050bc reportErr;
  anon_class_32_4_231050bc local_50;
  SourceLocation local_30;
  SourceRange local_28;
  
  local_30._1_7_ = in_register_00000009;
  local_30._0_1_ = flags.m_bits;
  local_50.assignLoc = &local_30;
  local_50.varRange = &local_28;
  uVar3 = *(ushort *)((long)&context[6].scope.ptr + 4);
  pVVar6 = this;
  local_50.context = (ASTContext *)this;
  local_50.var = (VariableSymbol *)context;
  local_28.startLoc = assignLoc;
  if ((uVar3 & 1) != 0) {
    do {
      piVar2 = *(int **)(*(long *)&pVVar6->super_Expression + 8);
      pVVar6 = (ValueExpressionBase *)(piVar2 + 8);
    } while (*piVar2 == 0x3a);
    pEVar4 = DeclaredType::getInitializer((DeclaredType *)&context[1].lookupIndex);
    code.subsystem = Expressions;
    code.code = 0x18;
    if (((pEVar4 != (Expression *)0x0) || (*piVar2 != 0x40)) ||
       ((*(byte *)(piVar2 + 0x31) & 8) == 0)) goto LAB_0062b8ad;
    uVar3 = *(ushort *)((long)&context[6].scope.ptr + 4);
  }
  code.subsystem = Expressions;
  code.code = 0x34;
  if ((uVar3 & 0x10) == 0 || ((ulong)var & 1) != 0) {
    iVar1 = *(int *)&(context->scope).ptr;
    if ((((ulong)var & 1) == 0) || (*(int *)&context[6].scope.ptr != 0)) {
      if (iVar1 == 0x53) {
        if (((ulong)var & 2) != 0) {
          checkVariableAssignment::anon_class_32_4_231050bc::operator()
                    (&local_50,(DiagCode)0x3e0007);
        }
        bVar7 = context[6].lookupIndex != 0;
        DVar5.subsystem = Statements;
        DVar5.code = 0xb;
        code.subsystem = Statements;
        code.code = 0x52;
        if (bVar7) {
          code = DVar5;
        }
        if ((bVar7 & (byte)var) != 1) goto LAB_0062b8ad;
      }
    }
    else {
      code.subsystem = Expressions;
      code.code = 0x81;
      if (iVar1 != 0x3f) goto LAB_0062b8ad;
    }
    code.subsystem = Expressions;
    code.code = 0x5a;
    if (((ulong)var & 0x10) == 0) {
      return true;
    }
  }
LAB_0062b8ad:
  checkVariableAssignment::anon_class_32_4_231050bc::operator()(&local_50,code);
  return false;
}

Assistant:

bool ValueExpressionBase::checkVariableAssignment(const ASTContext& context,
                                                  const VariableSymbol& var,
                                                  bitmask<AssignFlags> flags,
                                                  SourceLocation assignLoc, SourceRange varRange) {
    auto reportErr = [&](DiagCode code) {
        if (!assignLoc)
            assignLoc = varRange.start();

        auto& diag = context.addDiag(code, assignLoc);
        diag.addNote(diag::NoteDeclarationHere, var.location);
        diag << var.name << varRange;
        return false;
    };

    if (var.flags.has(VariableFlags::Const)) {
        // If we are in a class constructor and this variable does not have an initializer,
        // it's ok to assign to it.
        const Symbol* parent = &context.scope->asSymbol();
        while (parent->kind == SymbolKind::StatementBlock) {
            auto parentScope = parent->getParentScope();
            SLANG_ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (var.getInitializer() || parent->kind != SymbolKind::Subroutine ||
            (parent->as<SubroutineSymbol>().flags & MethodFlags::Constructor) == 0) {
            return reportErr(diag::AssignmentToConstVar);
        }
    }

    if (var.flags.has(VariableFlags::CheckerFreeVariable) && !flags.has(AssignFlags::NonBlocking))
        return reportErr(diag::BlockingAssignToFreeVar);

    if (flags.has(AssignFlags::NonBlocking) && var.lifetime == VariableLifetime::Automatic &&
        var.kind != SymbolKind::ClassProperty) {
        return reportErr(diag::NonblockingAssignmentToAuto);
    }

    if (var.kind == SymbolKind::ClockVar) {
        if (flags.has(AssignFlags::InConcat))
            reportErr(diag::ClockVarAssignConcat);

        auto& cv = var.as<ClockVarSymbol>();
        if (cv.direction == ArgumentDirection::In)
            return reportErr(diag::WriteToInputClockVar);

        if (!flags.has(AssignFlags::NonBlocking))
            return reportErr(diag::ClockVarSyncDrive);
    }

    if (flags.has(AssignFlags::InOutPort))
        return reportErr(diag::InOutVarPortConn);

    return true;
}